

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

int poolGrow(STRING_POOL *pool)

{
  block *pbVar1;
  int iVar2;
  BLOCK *pBVar3;
  XML_Char *pXVar4;
  XML_Char *pXVar5;
  size_t sVar6;
  ulong uVar7;
  
  pBVar3 = pool->freeBlocks;
  if (pBVar3 != (BLOCK *)0x0) {
    pXVar4 = pool->start;
    if (pXVar4 == (XML_Char *)0x0) {
      pool->blocks = pBVar3;
      pool->freeBlocks = pBVar3->next;
      pBVar3->next = (block *)0x0;
      pool->start = pBVar3->s;
      pool->end = pBVar3->s + pBVar3->size;
      pool->ptr = pBVar3->s;
      return 1;
    }
    sVar6 = (long)pool->end - (long)pXVar4;
    if ((long)sVar6 < (long)pBVar3->size) {
      pbVar1 = pBVar3->next;
      pBVar3->next = pool->blocks;
      pool->blocks = pBVar3;
      pool->freeBlocks = pbVar1;
      memcpy(pBVar3->s,pXVar4,sVar6);
      pBVar3 = pool->blocks;
      pool->ptr = pool->ptr + (long)pBVar3 + (0xc - (long)pool->start);
      pool->start = pBVar3->s;
      pXVar4 = pBVar3->s + pBVar3->size;
      goto LAB_0014e470;
    }
  }
  pBVar3 = pool->blocks;
  iVar2 = (int)pool->end - (int)pool->start;
  if (pool->start == pBVar3->s && pBVar3 != (BLOCK *)0x0) {
    iVar2 = iVar2 * 2;
    pBVar3 = (BLOCK *)(*pool->mem->realloc_fcn)(pBVar3,(long)iVar2 + 0xc);
    pool->blocks = pBVar3;
    if (pBVar3 == (BLOCK *)0x0) {
      return 0;
    }
    pBVar3->size = iVar2;
    pool->ptr = pool->ptr + (long)pBVar3 + (0xc - (long)pool->start);
    pool->start = pBVar3->s;
    pXVar4 = pBVar3->s + iVar2;
  }
  else {
    uVar7 = (ulong)(uint)(iVar2 * 2);
    if (iVar2 < 0x400) {
      uVar7 = 0x400;
    }
    pBVar3 = (BLOCK *)(*pool->mem->malloc_fcn)(uVar7 + 0xc);
    if (pBVar3 == (BLOCK *)0x0) {
      return 0;
    }
    pBVar3->size = (int)uVar7;
    pBVar3->next = pool->blocks;
    pool->blocks = pBVar3;
    pXVar4 = pool->ptr;
    sVar6 = (long)pXVar4 - (long)pool->start;
    pXVar5 = pXVar4;
    if (sVar6 != 0) {
      memcpy(pBVar3->s,pool->start,sVar6);
      pXVar5 = pool->ptr;
      pXVar4 = pool->start;
    }
    pool->ptr = pXVar5 + (0xc - (long)pXVar4) + (long)(pBVar3->s + -0xc);
    pool->start = pBVar3->s;
    pXVar4 = pBVar3->s + uVar7;
  }
LAB_0014e470:
  pool->end = pXVar4;
  return 1;
}

Assistant:

static
int poolGrow(STRING_POOL *pool)
{
  if (pool->freeBlocks) {
    if (pool->start == 0) {
      pool->blocks = pool->freeBlocks;
      pool->freeBlocks = pool->freeBlocks->next;
      pool->blocks->next = 0;
      pool->start = pool->blocks->s;
      pool->end = pool->start + pool->blocks->size;
      pool->ptr = pool->start;
      return 1;
    }
    if (pool->end - pool->start < pool->freeBlocks->size) {
      BLOCK *tem = pool->freeBlocks->next;
      pool->freeBlocks->next = pool->blocks;
      pool->blocks = pool->freeBlocks;
      pool->freeBlocks = tem;
      memcpy(pool->blocks->s, pool->start, (pool->end - pool->start) * sizeof(XML_Char));
      pool->ptr = pool->blocks->s + (pool->ptr - pool->start);
      pool->start = pool->blocks->s;
      pool->end = pool->start + pool->blocks->size;
      return 1;
    }
  }
  if (pool->blocks && pool->start == pool->blocks->s) {
    int blockSize = (pool->end - pool->start)*2;
    pool->blocks = pool->mem->realloc_fcn(pool->blocks, offsetof(BLOCK, s) + blockSize * sizeof(XML_Char));
    if (!pool->blocks)
      return 0;
    pool->blocks->size = blockSize;
    pool->ptr = pool->blocks->s + (pool->ptr - pool->start);
    pool->start = pool->blocks->s;
    pool->end = pool->start + blockSize;
  }
  else {
    BLOCK *tem;
    int blockSize = pool->end - pool->start;
    if (blockSize < INIT_BLOCK_SIZE)
      blockSize = INIT_BLOCK_SIZE;
    else
      blockSize *= 2;
    tem = pool->mem->malloc_fcn(offsetof(BLOCK, s) + blockSize * sizeof(XML_Char));
    if (!tem)
      return 0;
    tem->size = blockSize;
    tem->next = pool->blocks;
    pool->blocks = tem;
    if (pool->ptr != pool->start)
      memcpy(tem->s, pool->start, (pool->ptr - pool->start) * sizeof(XML_Char));
    pool->ptr = tem->s + (pool->ptr - pool->start);
    pool->start = tem->s;
    pool->end = tem->s + blockSize;
  }
  return 1;
}